

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::seekValueGenericJoin
          (CppGenerator *this,size_t depth,string *rel_name,string *attr_name,bool parallel,
          bool firstFactor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  string resetMaxVal;
  string findUpperBound;
  string upperPointer;
  string depthString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  CppGenerator *in_stack_ffffffffffffe358;
  string local_1c88 [32];
  string local_1c68 [32];
  string local_1c48 [31];
  undefined1 in_stack_ffffffffffffe3d7;
  size_t in_stack_ffffffffffffe3d8;
  string *in_stack_ffffffffffffe3e0;
  CppGenerator *in_stack_ffffffffffffe3e8;
  string local_1c08 [32];
  string local_1be8 [32];
  string local_1bc8 [32];
  string local_1ba8 [32];
  string local_1b88 [32];
  string local_1b68 [32];
  string local_1b48 [32];
  string local_1b28 [32];
  string local_1b08 [32];
  string local_1ae8 [32];
  string local_1ac8 [32];
  string local_1aa8 [32];
  string local_1a88 [32];
  string local_1a68 [32];
  string local_1a48 [32];
  string local_1a28 [32];
  string local_1a08 [32];
  string local_19e8 [32];
  string local_19c8 [32];
  string local_19a8 [32];
  string local_1988 [32];
  string local_1968 [32];
  string local_1948 [32];
  string local_1928 [32];
  string local_1908 [32];
  string local_18e8 [32];
  string local_18c8 [32];
  string local_18a8 [32];
  string local_1888 [32];
  string local_1868 [32];
  string local_1848 [32];
  string local_1828 [32];
  string local_1808 [32];
  string local_17e8 [32];
  string local_17c8 [32];
  string local_17a8 [32];
  string local_1788 [32];
  string local_1768 [32];
  string local_1748 [32];
  string local_1728 [32];
  string local_1708 [32];
  string local_16e8 [32];
  string local_16c8 [32];
  string local_16a8 [32];
  string local_1688 [32];
  string local_1668 [32];
  string local_1648 [32];
  string local_1628 [32];
  string local_1608 [32];
  string local_15e8 [32];
  string local_15c8 [32];
  string local_15a8 [32];
  string local_1588 [32];
  string local_1568 [32];
  string local_1548 [32];
  string local_1528 [32];
  string local_1508 [32];
  string local_14e8 [32];
  string local_14c8 [32];
  string local_14a8 [32];
  string local_1488 [32];
  string local_1468 [32];
  string local_1448 [32];
  string local_1428 [32];
  string local_1408 [32];
  string local_13e8 [32];
  string local_13c8 [32];
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [32];
  string local_1048 [32];
  string local_1028 [32];
  string local_1008 [32];
  string local_fe8 [32];
  string local_fc8 [32];
  string local_fa8 [32];
  string local_f88 [32];
  string local_f68 [32];
  string local_f48 [32];
  string local_f28 [32];
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [32];
  string local_ea8 [32];
  string local_e88 [32];
  string local_e68 [32];
  string local_e48 [32];
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [39];
  undefined1 local_d41 [33];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [48];
  string local_90 [32];
  string local_70 [32];
  string local_50 [38];
  byte local_2a;
  byte local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_20 = in_RCX;
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe358);
  std::__cxx11::string::string(local_90,(string *)local_20);
  getUpperPointer(in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe3d8,
                  (bool)in_stack_ffffffffffffe3d7);
  std::__cxx11::string::~string(local_90);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_3e0);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::operator+(in_RCX,in_stack_ffffffffffffe320);
  std::operator+(in_RCX,(char *)in_stack_ffffffffffffe320);
  std::__cxx11::string::operator+=(local_c0,local_4c0);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_d20);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::string::~string(local_d00);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_5e0);
  std::__cxx11::string::~string(local_ce0);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_cc0);
  std::__cxx11::string::~string(local_640);
  std::__cxx11::string::~string(local_660);
  std::__cxx11::string::~string(local_ca0);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_c80);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::~string(local_c60);
  std::__cxx11::string::~string(local_700);
  std::__cxx11::string::~string(local_720);
  std::__cxx11::string::~string(local_740);
  std::__cxx11::string::~string(local_760);
  std::__cxx11::string::~string(local_780);
  std::__cxx11::string::~string(local_7a0);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::string::~string(local_7e0);
  std::__cxx11::string::~string(local_c40);
  std::__cxx11::string::~string(local_800);
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string(local_c20);
  std::__cxx11::string::~string(local_840);
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string(local_880);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string(local_900);
  std::__cxx11::string::~string(local_920);
  std::__cxx11::string::~string(local_c00);
  std::__cxx11::string::~string(local_940);
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_be0);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string(local_9a0);
  std::__cxx11::string::~string(local_bc0);
  std::__cxx11::string::~string(local_9c0);
  std::__cxx11::string::~string(local_9e0);
  std::__cxx11::string::~string(local_ba0);
  std::__cxx11::string::~string(local_a00);
  std::__cxx11::string::~string(local_a20);
  std::__cxx11::string::~string(local_b80);
  std::__cxx11::string::~string(local_a40);
  std::__cxx11::string::~string(local_a60);
  std::__cxx11::string::~string(local_a80);
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_b60);
  std::__cxx11::string::~string(local_ac0);
  std::__cxx11::string::~string(local_ae0);
  std::__cxx11::string::~string(local_b40);
  std::__cxx11::string::~string(local_b00);
  std::__cxx11::string::~string(local_b20);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_d41 + 1),"",(allocator *)__rhs);
  std::allocator<char>::~allocator((allocator<char> *)local_d41);
  if ((local_2a & 1) == 0) {
    offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe358,in_RSI);
    std::operator+(in_RCX,(char *)__rhs);
    offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe358,in_RSI);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe358,in_RSI);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe358,in_RSI);
    std::operator+(in_RCX,(char *)__rhs);
    offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe358,in_RSI);
    std::operator+(in_RCX,(char *)__rhs);
    std::__cxx11::string::operator=((string *)(local_d41 + 1),local_ee8);
    std::__cxx11::string::~string(local_ee8);
    std::__cxx11::string::~string(local_f08);
    std::__cxx11::string::~string(local_13a8);
    std::__cxx11::string::~string(local_f28);
    std::__cxx11::string::~string(local_f48);
    std::__cxx11::string::~string(local_1388);
    std::__cxx11::string::~string(local_f68);
    std::__cxx11::string::~string(local_f88);
    std::__cxx11::string::~string(local_fa8);
    std::__cxx11::string::~string(local_fc8);
    std::__cxx11::string::~string(local_1368);
    std::__cxx11::string::~string(local_fe8);
    std::__cxx11::string::~string(local_1008);
    std::__cxx11::string::~string(local_1028);
    std::__cxx11::string::~string(local_1048);
    std::__cxx11::string::~string(local_1068);
    std::__cxx11::string::~string(local_1088);
    std::__cxx11::string::~string(local_10a8);
    std::__cxx11::string::~string(local_10c8);
    std::__cxx11::string::~string(local_10e8);
    std::__cxx11::string::~string(local_1108);
    std::__cxx11::string::~string(local_1128);
    std::__cxx11::string::~string(local_1148);
    std::__cxx11::string::~string(local_1348);
    std::__cxx11::string::~string(local_1168);
    std::__cxx11::string::~string(local_1188);
    std::__cxx11::string::~string(local_1328);
    std::__cxx11::string::~string(local_11a8);
    std::__cxx11::string::~string(local_11c8);
    std::__cxx11::string::~string(local_11e8);
    std::__cxx11::string::~string(local_1208);
    std::__cxx11::string::~string(local_1228);
    std::__cxx11::string::~string(local_1248);
    std::__cxx11::string::~string(local_1268);
    std::__cxx11::string::~string(local_1288);
    std::__cxx11::string::~string(local_12a8);
    std::__cxx11::string::~string(local_12c8);
    std::__cxx11::string::~string(local_12e8);
    std::__cxx11::string::~string(local_1308);
  }
  else {
    offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::operator+(in_RCX,__rhs);
    std::operator+(in_RCX,(char *)__rhs);
    std::__cxx11::string::operator=((string *)(local_d41 + 1),local_d68);
    std::__cxx11::string::~string(local_d68);
    std::__cxx11::string::~string(local_d88);
    std::__cxx11::string::~string(local_da8);
    std::__cxx11::string::~string(local_dc8);
    std::__cxx11::string::~string(local_de8);
    std::__cxx11::string::~string(local_e08);
    std::__cxx11::string::~string(local_e28);
    std::__cxx11::string::~string(local_e48);
    std::__cxx11::string::~string(local_e68);
    std::__cxx11::string::~string(local_e88);
    std::__cxx11::string::~string(local_ea8);
    std::__cxx11::string::~string(local_ec8);
  }
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::__cxx11::string::string(local_1b88,(string *)local_20);
  getUpperPointer(in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe3d8,
                  (bool)in_stack_ffffffffffffe3d7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::operator+(in_RCX,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe358,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe358,in_RSI);
  std::operator+(in_RCX,(char *)__rhs);
  std::operator+(in_RCX,__rhs);
  std::__cxx11::string::~string(local_13c8);
  std::__cxx11::string::~string(local_13e8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffe358);
  std::__cxx11::string::~string(local_1408);
  std::__cxx11::string::~string(local_1428);
  std::__cxx11::string::~string(local_1448);
  std::__cxx11::string::~string(local_1468);
  std::__cxx11::string::~string(local_1488);
  std::__cxx11::string::~string(local_14a8);
  std::__cxx11::string::~string(local_14c8);
  std::__cxx11::string::~string(local_14e8);
  std::__cxx11::string::~string(local_1508);
  std::__cxx11::string::~string(local_1528);
  std::__cxx11::string::~string(local_1548);
  std::__cxx11::string::~string(local_1568);
  std::__cxx11::string::~string(local_1c88);
  std::__cxx11::string::~string(local_1588);
  std::__cxx11::string::~string(local_15a8);
  std::__cxx11::string::~string(local_15c8);
  std::__cxx11::string::~string(local_15e8);
  std::__cxx11::string::~string(local_1608);
  std::__cxx11::string::~string(local_1628);
  std::__cxx11::string::~string(local_1648);
  std::__cxx11::string::~string(local_1668);
  std::__cxx11::string::~string(local_1688);
  std::__cxx11::string::~string(local_16a8);
  std::__cxx11::string::~string(local_16c8);
  std::__cxx11::string::~string(local_16e8);
  std::__cxx11::string::~string(local_1c68);
  std::__cxx11::string::~string(local_1708);
  std::__cxx11::string::~string(local_1728);
  std::__cxx11::string::~string(local_1748);
  std::__cxx11::string::~string(local_1c48);
  std::__cxx11::string::~string(local_1768);
  std::__cxx11::string::~string(local_1788);
  std::__cxx11::string::~string(local_17a8);
  std::__cxx11::string::~string(local_17c8);
  std::__cxx11::string::~string(local_17e8);
  std::__cxx11::string::~string(local_1808);
  std::__cxx11::string::~string(local_1828);
  std::__cxx11::string::~string(local_1848);
  std::__cxx11::string::~string(local_1868);
  std::__cxx11::string::~string(local_1888);
  std::__cxx11::string::~string(local_18a8);
  std::__cxx11::string::~string(local_18c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffe3d8);
  std::__cxx11::string::~string(local_18e8);
  std::__cxx11::string::~string(local_1908);
  std::__cxx11::string::~string(local_1c08);
  std::__cxx11::string::~string(local_1928);
  std::__cxx11::string::~string(local_1948);
  std::__cxx11::string::~string(local_1be8);
  std::__cxx11::string::~string(local_1968);
  std::__cxx11::string::~string(local_1988);
  std::__cxx11::string::~string(local_19a8);
  std::__cxx11::string::~string(local_19c8);
  std::__cxx11::string::~string(local_1bc8);
  std::__cxx11::string::~string(local_19e8);
  std::__cxx11::string::~string(local_1a08);
  std::__cxx11::string::~string(local_1ba8);
  std::__cxx11::string::~string(local_1a28);
  std::__cxx11::string::~string(local_1a48);
  std::__cxx11::string::~string(local_1a68);
  std::__cxx11::string::~string(local_1a88);
  std::__cxx11::string::~string(local_1b68);
  std::__cxx11::string::~string(local_1b88);
  std::__cxx11::string::~string(local_1aa8);
  std::__cxx11::string::~string(local_1ac8);
  std::__cxx11::string::~string(local_1ae8);
  std::__cxx11::string::~string(local_1b08);
  std::__cxx11::string::~string(local_1b28);
  std::__cxx11::string::~string(local_1b48);
  std::__cxx11::string::~string((string *)(local_d41 + 1));
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string CppGenerator::seekValueGenericJoin(
    size_t depth, const std::string& rel_name, const std::string& attr_name,
    bool parallel, bool firstFactor)
{
    const std::string depthString = std::to_string(depth);
    const std::string upperPointer = getUpperPointer(rel_name,depth,parallel);
    
    std::string findUpperBound = 
        offset(5+depth)+"leap = 1;\n"+
        offset(5+depth)+"high = lowerptr_"+rel_name+"["+depthString+"];\n"+
        offset(5+depth)+"while (high <= "+
        upperPointer+" && "+rel_name+"[high]."+attr_name+" < max_"+attr_name+")\n"+
        offset(5+depth)+"{\n"+
        offset(6+depth)+"high += leap;\n"+
        offset(6+depth)+"leap *= 2;\n"+
        offset(5+depth)+"}\n";

    /*
     * When we found an upper bound; to find the least upper bound;
     * use binary search to backtrack.
     */ 
    findUpperBound += offset(5+depth)+"/* Backtrack with binary search */\n"+
        // offset(6+depth)+"if (leap > 2 && max_"+attr_name+" <= "+rel_name+
        // "[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"
        // +offset(6+depth)+"{\n"+
        offset(5+depth)+"leap /= 2;\n"+
        offset(5+depth)+"high = std::min(high,"+upperPointer+");\n"+
        offset(5+depth)+"low = high - leap; mid = 0;\n"+
        offset(5+depth)+"while (low <= high)\n"+
        offset(5+depth)+"{\n"+
        offset(6+depth)+"mid = (high + low) / 2;\n"+
        // offset(8+depth)+"if(max_"+attr_name+" == "+rel_name+"[mid]."+attr_name+")\n"+
        // offset(8+depth)+"{\n"+
        // offset(9+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        // offset(9+depth)+"high = mid - 1;\n"+
        // offset(8+depth)+"}\n"+
        offset(6+depth)+"if (max_"+attr_name+" < "+rel_name+"[mid]."+attr_name+")\n"+
        offset(7+depth)+"high = mid - 1;\n"+
        offset(6+depth)+"else if(max_"+attr_name+" > "+rel_name+"[mid]."+attr_name+")\n"+
        offset(7+depth)+"low = mid + 1;\n"+
        offset(6+depth)+"else if  (low != mid)\n"+offset(7+depth)+"high = mid;\n"+
        offset(6+depth)+"else\n"+offset(7+depth)+"break;\n"+
        offset(5+depth)+"}\n"+
        // offset(7+depth)+"mid = (high + low) / 2;\n"+
        // offset(5+depth)+"if("+rel_name+"[mid-1]."+attr_name+">=max_"+attr_name+")\n"+
        // offset(6+depth)+"std::cout << \"ERROR : "+rel_name+"[mid-1]."+
        // attr_name+" >= max_"+attr_name+"\\n\";\n"+
        // offset(5+depth)+"if("+rel_name+"[mid]."+attr_name+"<max_"+attr_name+")\n"+
        // offset(6+depth)+"std::cout << \"ERROR : "+rel_name+"[mid]."+
        // attr_name+" < max_"+attr_name+"\\n\";\n"+
        offset(5+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n";
        // offset(6+depth)+"}\n";

    std::string resetMaxVal = "";
    if (firstFactor)
    {
        resetMaxVal = offset(4+depth)+"max_"+attr_name+" = "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+";\n";
    }
    else
    {
        resetMaxVal = offset(4+depth)+"if (max_"+attr_name+" < "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"+
            offset(4+depth)+"{\n"+offset(5+depth)+"max_"+attr_name+" = "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+";\n"+
            offset(5+depth)+"found["+depthString+"] = false;\n"+
            offset(5+depth)+"continue;\n"+
            offset(4+depth)+"}\n";
    }
    
    
    return /*offset(4+depth)+"if("+rel_name+"[lowerptr_"+rel_name+"["+
        std::to_string(depth)+"]]."+attr_name+" == max_"+attr_name+")\n"+
        offset(5+depth)+"found["+depthString+"] = true;\n"+*/
        // else if 
        offset(4+depth)+"if(max_"+attr_name+" > "+rel_name+"["+
        getUpperPointer(rel_name, depth, parallel)+"]."+attr_name+")\n"+
        offset(4+depth)+"{\n"+offset(5+depth)+"atEnd["+depthString+"] = true;\n"+
        offset(5+depth)+"break;\n"+offset(4+depth)+"}\n"+
        //else 
        offset(4+depth)+"else if (max_"+attr_name+" > "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"+
        offset(4+depth)+"{\n"+findUpperBound+
        offset(5+depth)+"if (max_"+attr_name+" > "+rel_name+"[lowerptr_"+
        rel_name+"["+depthString+"]]."+attr_name+")\n"+
        offset(6+depth)+"std::cout << \"ERROR: max_"+attr_name+" > "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+"\\n\";\n"+
        offset(4+depth)+"}\n"+
        resetMaxVal;
}